

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
          (View<unsigned_char,_true,_std::allocator<unsigned_long>_> *this,allocator_type *allocator
          )

{
  this->data_ = (pointer)0x0;
  (this->geometry_).size_ = 0;
  (this->geometry_).shape_ = (size_t *)0x0;
  (this->geometry_).shapeStrides_ = (size_t *)0x0;
  (this->geometry_).strides_ = (size_t *)0x0;
  (this->geometry_).dimension_ = 0;
  (this->geometry_).coordinateOrder_ = LastMajorOrder;
  (this->geometry_).isSimple_ = true;
  testInvariant(this);
  return;
}

Assistant:

inline
View<T, isConst, A>::View
(
    const allocator_type& allocator
)
: data_(0),
  geometry_(geometry_type(allocator))
{
    testInvariant();
}